

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QMap<ProKey,_ProStringList>_>_>::freeData
          (Span<QHashPrivate::Node<QString,_QMap<ProKey,_ProStringList>_>_> *this)

{
  byte bVar1;
  Data *pDVar2;
  Node<QString,_QMap<ProKey,_ProStringList>_> *pNVar3;
  Node<QString,_QMap<ProKey,_ProStringList>_> *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  Node<QString,_QMap<ProKey,_ProStringList>_> *local_18;
  
  if (in_RDI[4].key.d.d != (Data *)0x0) {
    pNVar3 = in_RDI + 4;
    for (local_18 = in_RDI; local_18 != pNVar3;
        local_18 = (Node<QString,_QMap<ProKey,_ProStringList>_> *)((long)&(local_18->key).d.d + 1))
    {
      bVar1 = *(byte *)&(local_18->key).d.d;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)(in_RDI[4].key.d.d + (ulong)bVar1 * 2));
        Node<QString,_QMap<ProKey,_ProStringList>_>::~Node(in_RDI);
      }
    }
    pDVar2 = in_RDI[4].key.d.d;
    if (pDVar2 != (Data *)0x0) {
      operator_delete__(pDVar2);
    }
    in_RDI[4].key.d.d = (Data *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }